

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<9,_TFad<6,_double>_>::TPZFNMatrix
          (TPZFNMatrix<9,_TFad<6,_double>_> *this,int64_t row,int64_t col,TFad<6,_double> *val)

{
  TPZFMatrix<TFad<6,_double>_> *pTVar1;
  TPZFMatrix<TFad<6,_double>_> *pTVar2;
  TPZFMatrix<TFad<6,_double>_> *in_RCX;
  TPZFMatrix<TFad<6,_double>_> *in_RDI;
  TFad<6,_double> *in_stack_ffffffffffffff40;
  TFad<6,_double> *in_stack_ffffffffffffff48;
  TPZFMatrix<TFad<6,_double>_> *local_88;
  double in_stack_ffffffffffffffb8;
  TFad<6,_double> *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  int64_t rows;
  void **vtt;
  
  vtt = (void **)0x0;
  rows = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<9,TFad<6,double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  (in_RDI->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFNMatrix_024393e8;
  TPZFMatrix<TFad<6,_double>_>::TPZFMatrix
            (in_RCX,vtt,rows,(int64_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int64_t)in_stack_ffffffffffffffb8);
  (in_RDI->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFNMatrix_024393e8;
  pTVar1 = in_RDI + 5;
  pTVar2 = in_RDI + 1;
  do {
    local_88 = pTVar2;
    TFad<6,_double>::TFad(in_stack_ffffffffffffff40);
    pTVar2 = (TPZFMatrix<TFad<6,_double>_> *)&(local_88->fPivot).super_TPZVec<int>.fStore;
  } while (pTVar2 != (TPZFMatrix<TFad<6,_double>_> *)&(pTVar1->fPivot).super_TPZVec<int>.fStore);
  TFad<6,_double>::TFad((TFad<6,_double> *)&stack0xffffffffffffff90,in_stack_ffffffffffffff48);
  TPZFMatrix<TFad<6,_double>_>::operator=(in_RDI,(TFad<6,_double> *)local_88);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14cd73f);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }